

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> * __thiscall
dg::dda::MemorySSATransformation::findDefinitions
          (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__return_storage_ptr__,
          MemorySSATransformation *this,RWBBlock *block,DefSite *ds)

{
  Definitions *this_00;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_60;
  
  this_00 = getBBlockDefinitions(this,block,ds);
  Definitions::get((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)&local_60,this_00,ds);
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_initialize<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)__return_storage_ptr__,
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_60._M_impl.super__Rb_tree_header);
  addUncoveredFromPredecessors(this,block,this_00,ds,__return_storage_ptr__);
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RWNode *>
MemorySSATransformation::findDefinitions(RWBBlock *block, const DefSite &ds) {
    assert(ds.target && "Target is null");
    assert(block && "Block is null");

    // Find known definitions.
    auto &D = getBBlockDefinitions(block, &ds);
    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    std::vector<RWNode *> defs(defSet.begin(), defSet.end());

    addUncoveredFromPredecessors(block, D, ds, defs);

    return defs;
}